

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

string * __thiscall
pbrt::BDPTIntegrator::ToString_abi_cxx11_(string *__return_storage_ptr__,BDPTIntegrator *this)

{
  LightSamplerHandle *in_stack_fffffffffffffff0;
  
  StringPrintf<int_const&,bool_const&,bool_const&,bool_const&,pbrt::LightSamplerHandle_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ BDPTIntegrator maxDepth: %d visualizeStrategies: %s visualizeWeights: %s regularize: %s lightSampler: %s ]"
             ,(char *)&this->maxDepth,(int *)&this->visualizeStrategies,&this->visualizeWeights,
             &this->regularize,(bool *)&this->lightSampler,in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string BDPTIntegrator::ToString() const {
    return StringPrintf("[ BDPTIntegrator maxDepth: %d visualizeStrategies: %s "
                        "visualizeWeights: %s regularize: %s lightSampler: %s ]",
                        maxDepth, visualizeStrategies, visualizeWeights, regularize,
                        lightSampler);
}